

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutSeq.c
# Opt level: O2

void Cut_NodeShiftCutLeaves(Cut_Cut_t *pList,int nLat)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  
  for (; pList != (Cut_Cut_t *)0x0; pList = pList->pNext) {
    pList->uSign = 0;
    uVar1 = *(uint *)pList;
    uVar3 = 0;
    for (uVar4 = 0; uVar4 < uVar1 >> 0x1c; uVar4 = uVar4 + 1) {
      uVar2 = *(uint *)((long)&pList[1].field_0x0 + uVar4 * 4) + nLat;
      *(uint *)((long)&pList[1].field_0x0 + uVar4 * 4) = uVar2;
      uVar3 = uVar3 | 1 << ((int)uVar2 % 0x1f & 0x1fU);
      pList->uSign = uVar3;
    }
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Shifts all cut leaves of the node by the given number of latches.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
static inline void Cut_NodeShiftCutLeaves( Cut_Cut_t * pList, int nLat )
{
    Cut_Cut_t * pTemp;
    int i;
    // shift the cuts by as many latches
    Cut_ListForEachCut( pList, pTemp )
    {
        pTemp->uSign = 0;
        for ( i = 0; i < (int)pTemp->nLeaves; i++ )
        {
            pTemp->pLeaves[i] += nLat;
            pTemp->uSign      |= Cut_NodeSign( pTemp->pLeaves[i] );
        }
    }
}